

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeIfReturn
          (SimplifyLocals<true,_true,_true> *this,If *iff,Expression **currp)

{
  Expression *pEVar1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *pvVar2;
  Builder this_00;
  bool bVar3;
  pointer ppVar4;
  Function *this_01;
  size_t sVar5;
  Expression **ppEVar6;
  Module *wasm;
  mapped_type *pmVar7;
  Nop *pNVar8;
  LocalGet *pLVar9;
  reference pvVar10;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  bool local_99;
  BasicType local_98 [2];
  optional<wasm::Type> local_90;
  Block *local_80;
  BasicType local_78 [2];
  optional<wasm::Type> local_70;
  LocalSet *local_60;
  LocalSet *set;
  Expression **item;
  Builder builder;
  Block *ifTrueBlock;
  Type localType;
  Index local_2c;
  BasicType local_28;
  Index goodIndex;
  Expression **local_20;
  Expression **currp_local;
  If *iff_local;
  SimplifyLocals<true,_true,_true> *this_local;
  
  goodIndex = 0;
  local_20 = currp;
  currp_local = (Expression **)iff;
  iff_local = (If *)this;
  bVar3 = wasm::Type::operator!=
                    (&(iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type
                     ,&goodIndex);
  local_99 = true;
  if (!bVar3) {
    local_28 = none;
    local_99 = wasm::Type::operator!=(&currp_local[3]->type,&local_28);
  }
  if ((local_99 == false) &&
     (bVar3 = std::
              map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
              ::empty(&this->sinkables), !bVar3)) {
    localType.id = (uintptr_t)
                   std::
                   map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                   ::begin(&this->sinkables);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>
                           *)&localType);
    local_2c = ppVar4->first;
    this_01 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
              ::getFunction((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                             *)&(this->
                                super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                ).
                                super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                           );
    ifTrueBlock = (Block *)Function::getLocalType(this_01,local_2c);
    bVar3 = wasm::Type::isDefaultable((Type *)&ifTrueBlock);
    if (bVar3) {
      builder.wasm = (Module *)Expression::dynCast<wasm::Block>(currp_local[3]);
      if (((builder.wasm != (Module *)0x0) &&
          (bVar3 = IString::is((IString *)
                               &((builder.wasm)->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar3)) &&
         (sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&((builder.wasm)->functions).
                               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish), sVar5 != 0)) {
        ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&((builder.wasm)->functions).
                               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
        bVar3 = Expression::is<wasm::Nop>(*ppEVar6);
        if (bVar3) {
          wasm = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                              *)&(this->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                            );
          Builder::Builder((Builder *)&item,wasm);
          pmVar7 = std::
                   map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                   ::at(&this->sinkables,&local_2c);
          set = (LocalSet *)pmVar7->item;
          local_60 = Expression::cast<wasm::LocalSet>
                               (*(Expression **)
                                 &(set->super_SpecificExpression<(wasm::Expression::Id)9>).
                                  super_Expression);
          pEVar1 = local_60->value;
          pvVar2 = &(builder.wasm)->functions;
          sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&((builder.wasm)->functions).
                               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)&(pvVar2->
                                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish,sVar5 - 1);
          *ppEVar6 = pEVar1;
          pNVar8 = Builder::makeNop((Builder *)&item);
          this_00 = builder;
          *(Nop **)&(set->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression =
               pNVar8;
          std::optional<wasm::Type>::optional(&local_70);
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_7_ = 0;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               local_70.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged =
               local_70.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_engaged;
          Block::finalize((Block *)this_00.wasm,type_,Unknown);
          local_78[0] = none;
          bVar3 = wasm::Type::operator!=
                            ((Type *)&((builder.wasm)->exports).
                                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,local_78);
          if (!bVar3) {
            __assert_fail("ifTrueBlock->type != Type::none",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                          ,0x33a,
                          "void wasm::SimplifyLocals<>::optimizeIfReturn(If *, Expression **) [allowTee = true, allowStructure = true, allowNesting = true]"
                         );
          }
          local_80 = ifTrueBlock;
          pLVar9 = Builder::makeLocalGet((Builder *)&item,local_60->index,(Type)ifTrueBlock);
          ppEVar6 = currp_local;
          currp_local[4] = (Expression *)pLVar9;
          std::optional<wasm::Type>::optional(&local_90);
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_7_ = 0;
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               local_90.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged =
               local_90.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_engaged;
          If::finalize((If *)ppEVar6,type__00);
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&(this->getCounter).num,(ulong)local_60->index);
          *pvVar10 = *pvVar10 + 1;
          local_98[0] = none;
          bVar3 = wasm::Type::operator!=((Type *)(currp_local + 1),local_98);
          if (bVar3) {
            local_60->value = (Expression *)currp_local;
            LocalSet::finalize(local_60);
            *local_20 = (Expression *)local_60;
            this->anotherCycle = true;
            return;
          }
          __assert_fail("iff->type != Type::none",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                        ,0x340,
                        "void wasm::SimplifyLocals<>::optimizeIfReturn(If *, Expression **) [allowTee = true, allowStructure = true, allowNesting = true]"
                       );
        }
      }
      std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::push_back
                (&this->ifsToEnlarge,(value_type *)&currp_local);
    }
  }
  return;
}

Assistant:

void optimizeIfReturn(If* iff, Expression** currp) {
    // If this if is unreachable code, we have nothing to do.
    if (iff->type != Type::none || iff->ifTrue->type != Type::none) {
      return;
    }
    // Anything sinkable is good for us.
    if (sinkables.empty()) {
      return;
    }

    // Check if the type makes sense. A non-nullable local might be dangerous
    // here, as creating new local.gets for such locals is risky:
    //
    //  (func $silly
    //    (local $x (ref $T))
    //    (if
    //      (condition)
    //      (local.set $x ..)
    //    )
    //  )
    //
    // That local is silly as the write is never read. If we optimize it and add
    // a local.get, however, then we'd no longer validate (as no set would
    // dominate that new get in the if's else arm). Fixups would add a
    // ref.as_non_null around the local.get, which will then trap at runtime:
    //
    //  (func $silly
    //    (local $x (ref null $T))
    //    (local.set $x
    //      (if
    //        (condition)
    //        (..)
    //        (ref.as_non_null
    //          (local.get $x)
    //        )
    //      )
    //    )
    //  )
    //
    // In other words, local.get is not necessarily free of effects if the local
    // is non-nullable - it must have been set already. We could check that
    // here, but running that linear-time check may not be worth it as this
    // optimization is fairly minor, so just skip the non-nullable case (and in
    // general, the non-defaultable case, of say a tuple with a non-nullable
    // element).
    //
    // TODO investigate more
    Index goodIndex = sinkables.begin()->first;
    auto localType = this->getFunction()->getLocalType(goodIndex);
    if (!localType.isDefaultable()) {
      return;
    }

    // Ensure we have a place to write the return values for, if not, we
    // need another cycle.
    auto* ifTrueBlock = iff->ifTrue->dynCast<Block>();
    if (!ifTrueBlock || ifTrueBlock->name.is() ||
        ifTrueBlock->list.size() == 0 || !ifTrueBlock->list.back()->is<Nop>()) {
      ifsToEnlarge.push_back(iff);
      return;
    }

    // We can optimize!

    // Update the ifTrue side.
    Builder builder(*this->getModule());
    auto** item = sinkables.at(goodIndex).item;
    auto* set = (*item)->template cast<LocalSet>();
    ifTrueBlock->list[ifTrueBlock->list.size() - 1] = set->value;
    *item = builder.makeNop();
    ifTrueBlock->finalize();
    assert(ifTrueBlock->type != Type::none);
    // Update the ifFalse side.
    iff->ifFalse = builder.makeLocalGet(set->index, localType);
    iff->finalize(); // update type
    // Update the get count.
    getCounter.num[set->index]++;
    assert(iff->type != Type::none);
    // Finally, reuse the local.set on the iff itself.
    set->value = iff;
    set->finalize();
    *currp = set;
    anotherCycle = true;
  }